

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O2

ssize_t __thiscall
LASreadItemCompressed_WAVEPACKET13_v1::read
          (LASreadItemCompressed_WAVEPACKET13_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  I32 pred;
  I32 pred_00;
  U64 *pUVar1;
  U64 UVar2;
  U8 *pUVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  U64 UVar7;
  U64 UVar8;
  U64 UVar9;
  U32 UVar10;
  I32 IVar11;
  undefined4 in_register_00000034;
  undefined1 *puVar12;
  LASwavepacket13 this_item_m;
  
  puVar12 = (undefined1 *)CONCAT44(in_register_00000034,__fd);
  UVar10 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_packet_index);
  *puVar12 = (char)UVar10;
  pUVar1 = (U64 *)this->last_item;
  UVar2 = *pUVar1;
  UVar7 = pUVar1[1];
  pred = *(I32 *)((long)pUVar1 + 0xc);
  UVar8 = pUVar1[2];
  pred_00 = *(I32 *)((long)pUVar1 + 0x14);
  UVar9 = pUVar1[3];
  UVar10 = ArithmeticDecoder::decodeSymbol
                     (this->dec,this->m_offset_diff[this->sym_last_offset_diff]);
  this->sym_last_offset_diff = UVar10;
  if (UVar10 == 2) {
    IVar11 = IntegerCompressor::decompress(this->ic_offset_diff,this->last_diff_32,0);
    this->last_diff_32 = IVar11;
    this_item_m.offset = UVar2 + (long)IVar11;
  }
  else if (UVar10 == 1) {
    this_item_m.offset = UVar2 + (uint)UVar7;
  }
  else {
    this_item_m.offset = UVar2;
    if (UVar10 != 0) {
      this_item_m.offset = ArithmeticDecoder::readInt64(this->dec);
    }
  }
  this_item_m.packet_size = IntegerCompressor::decompress(this->ic_packet_size,(uint)UVar7,0);
  this_item_m.return_point.i32 = IntegerCompressor::decompress(this->ic_return_point,pred,0);
  this_item_m.x.i32 = IntegerCompressor::decompress(this->ic_xyz,(I32)UVar8,0);
  this_item_m.y.i32 = IntegerCompressor::decompress(this->ic_xyz,pred_00,1);
  this_item_m.z.i32 = IntegerCompressor::decompress(this->ic_xyz,(I32)UVar9,2);
  LASwavepacket13::pack(&this_item_m,puVar12 + 1);
  pUVar3 = this->last_item;
  uVar4 = *(undefined8 *)(puVar12 + 1);
  uVar5 = *(undefined8 *)(puVar12 + 9);
  uVar6 = *(undefined8 *)(puVar12 + 0x15);
  *(undefined8 *)(pUVar3 + 0xc) = *(undefined8 *)(puVar12 + 0xd);
  *(undefined8 *)(pUVar3 + 0x14) = uVar6;
  *(undefined8 *)pUVar3 = uVar4;
  *(undefined8 *)(pUVar3 + 8) = uVar5;
  return (ssize_t)pUVar3;
}

Assistant:

inline void LASreadItemCompressed_WAVEPACKET13_v1::read(U8* item, U32& context)
{
  item[0] = (U8)(dec->decodeSymbol(m_packet_index));
  item++;

  LASwavepacket13 this_item_m;
  LASwavepacket13 last_item_m = LASwavepacket13::unpack(last_item);

  sym_last_offset_diff = dec->decodeSymbol(m_offset_diff[sym_last_offset_diff]);

  if (sym_last_offset_diff == 0)
  {
    this_item_m.offset = last_item_m.offset;
  }
  else if (sym_last_offset_diff == 1)
  {
    this_item_m.offset = last_item_m.offset + last_item_m.packet_size;
  }
  else if (sym_last_offset_diff == 2)
  {
    last_diff_32 = ic_offset_diff->decompress(last_diff_32);
    this_item_m.offset = last_item_m.offset + last_diff_32;
  }
  else
  {
    this_item_m.offset = dec->readInt64();
  }

  this_item_m.packet_size = ic_packet_size->decompress(last_item_m.packet_size);
  this_item_m.return_point.i32 = ic_return_point->decompress(last_item_m.return_point.i32);
  this_item_m.x.i32 = ic_xyz->decompress(last_item_m.x.i32, 0);
  this_item_m.y.i32 = ic_xyz->decompress(last_item_m.y.i32, 1);
  this_item_m.z.i32 = ic_xyz->decompress(last_item_m.z.i32, 2);

  this_item_m.pack(item);

  memcpy(last_item, item, 28);
}